

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::LegacyGeneratedClassFileName<google::protobuf::Descriptor>
                   (Descriptor *desc,bool is_descriptor)

{
  ulong uVar1;
  char *pcVar2;
  undefined1 *puVar3;
  byte in_DL;
  string *in_RDI;
  bool in_stack_00000017;
  Descriptor *in_stack_00000018;
  int i;
  string result;
  char *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  int local_3c;
  string local_38 [39];
  byte local_11;
  
  local_11 = in_DL & 1;
  LegacyFullClassName<google::protobuf::Descriptor>(in_stack_00000018,in_stack_00000017);
  local_3c = 0;
  while( true ) {
    uVar1 = std::__cxx11::string::size();
    if (uVar1 <= (ulong)(long)local_3c) break;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    if (*pcVar2 == '\\') {
      puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_38);
      *puVar3 = 0x2f;
    }
    local_3c = local_3c + 1;
  }
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

std::string LegacyGeneratedClassFileName(const DescriptorType* desc,
                                     bool is_descriptor) {
  std::string result = LegacyFullClassName(desc, is_descriptor);

  for (int i = 0; i < result.size(); i++) {
    if (result[i] == '\\') {
      result[i] = '/';
    }
  }
  return result + ".php";
}